

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::number_to_exponential_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int f)

{
  wchar_t wVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  wstringstream wss;
  ulong uStack_1b0;
  wostream local_1a8 [8];
  undefined4 local_1a0 [92];
  
  if ((ulong)ABS(x) < 0x7ff0000000000000) {
    uVar3 = (uint)this;
    if (uVar3 < 0x15) {
      std::__cxx11::wstringstream::wstringstream((wstringstream *)&wss);
      if (x < 0.0) {
        std::operator<<(local_1a8,L'-');
        x = -x;
      }
      uVar4 = 0x12;
      if (uVar3 != 0) {
        uVar4 = (ulong)this & 0xffffffff;
      }
      *(ulong *)((long)&uStack_1b0 + *(long *)(_wss + -0x18)) = uVar4;
      *(undefined4 *)((long)local_1a0 + *(long *)(_wss + -0x18)) = 0x100;
      std::wostream::_M_insert<double>(x);
      std::__cxx11::wstringbuf::str();
      if (uVar3 == 0) {
        lVar2 = std::__cxx11::wstring::rfind((wchar_t)__return_storage_ptr__,0x65);
        uVar4 = lVar2 - 1;
        if (0xfffffffffffffffd < uVar4) {
          __assert_fail("e_pos != std::wstring::npos && e_pos > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                        ,0xbc,"std::wstring mjs::number_to_exponential(double, int)");
        }
        for (; wVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar4], wVar1 == L'0';
            uVar4 = uVar4 - 1) {
          std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,uVar4);
        }
        if (wVar1 == L'.') {
          std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,uVar4);
        }
      }
      lVar2 = std::__cxx11::wstring::rfind((wchar_t)__return_storage_ptr__,0x65);
      if (((lVar2 != -1) && (lVar2 + 2U < __return_storage_ptr__->_M_string_length)) &&
         ((wVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[lVar2 + 1], wVar1 == L'+' ||
          (wVar1 == L'-')))) {
        while ((lVar2 + 3U < __return_storage_ptr__->_M_string_length &&
               ((__return_storage_ptr__->_M_dataplus)._M_p[lVar2 + 2] == L'0'))) {
          std::__cxx11::wstring::erase((ulong)__return_storage_ptr__,lVar2 + 2U);
        }
        std::__cxx11::wstringstream::~wstringstream((wstringstream *)&wss);
        return __return_storage_ptr__;
      }
      __assert_fail("e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == \'+\' || s[e_pos+1] == \'-\')"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                    ,0xcc,"std::wstring mjs::number_to_exponential(double, int)");
    }
  }
  __assert_fail("std::isfinite(x) && f >= 0 && f <= 20",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xae,"std::wstring mjs::number_to_exponential(double, int)");
}

Assistant:

std::wstring number_to_exponential(double x, int f) {
    // TODO: Implement actual rules from ES3, 15.7.4.6
    assert(std::isfinite(x) && f >= 0 && f <= 20);
    std::wstringstream wss;
    if (x < 0) {
        x = -x;
        wss << L'-';
    }
    wss.precision(f ? f : 18);
    wss.flags(std::ios::scientific);
    wss << x;
    auto s = wss.str();

    // Remove unnecessary digits (yuck)
    if (f == 0) {
        auto e_pos = s.find_last_of(L'e');
        assert(e_pos != std::wstring::npos && e_pos > 0);
        for (;;) {
            --e_pos;
            if (s[e_pos] == '.') {
                s.erase(e_pos, 1);
                break;
            }
            if (s[e_pos] != '0') {
                break;
            }
            s.erase(e_pos, 1);
        }
    }

    // Fix up the exponent to match ECMAscript format (yuck)
    auto e_pos = s.find_last_of(L'e');
    assert(e_pos != std::wstring::npos && e_pos+2 < s.length() && (s[e_pos+1] == '+' || s[e_pos+1] == '-'));
    e_pos += 2;

    // Remove leading zeros in exponent
    while (e_pos + 1 < s.length() && s[e_pos] == L'0') {
        s.erase(e_pos, 1);
    }

    return s;
}